

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_namer.h
# Opt level: O2

string * __thiscall
flatbuffers::IdlNamer::LegacyKotlinMethod
          (string *__return_storage_ptr__,IdlNamer *this,string *prefix,FieldDef *d,string *suffix)

{
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  (*(this->super_Namer)._vptr_Namer[0xe])(&local_40,this,d);
  ConvertCase(&local_80,&local_40,kUpperCamel,kSnake);
  std::operator+(&local_60,prefix,&local_80);
  std::operator+(__return_storage_ptr__,&local_60,suffix);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string LegacyKotlinMethod(const std::string &prefix, const FieldDef &d,
                                 const std::string &suffix) const {
    return prefix + ConvertCase(EscapeKeyword(d.name), Case::kUpperCamel) +
           suffix;
  }